

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall
QPlainTestLogger::addBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  bool bVar1;
  int iVar2;
  QList<QBenchmarkResult> *in_RSI;
  QBenchmarkResult *in_stack_00000050;
  QList<QBenchmarkResult> *in_stack_00000058;
  QPlainTestLogger *in_stack_00000060;
  
  iVar2 = QTestLog::verboseLevel();
  if ((-1 < iVar2) &&
     (bVar1 = QList<QBenchmarkResult>::isEmpty((QList<QBenchmarkResult> *)0x130fef), !bVar1)) {
    QList<QBenchmarkResult>::first(in_RSI);
    printBenchmarkResultsHeader((QPlainTestLogger *)in_stack_00000058,in_stack_00000050);
    printBenchmarkResults(in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void QPlainTestLogger::addBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    // suppress benchmark results in silent mode
    if (QTestLog::verboseLevel() < 0 || results.isEmpty())
        return;

    printBenchmarkResultsHeader(results.first());
    printBenchmarkResults(results);
}